

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_hwm.cpp
# Opt level: O2

void kokkosp_finalize_library(void)

{
  rusage rStack_a0;
  
  putchar(10);
  puts("KokkosP: Finalization of profiling library.");
  getrusage(RUSAGE_SELF,&rStack_a0);
  printf("KokkosP: High water mark memory consumption: %li kB\n",rStack_a0.ru_maxrss);
  putchar(10);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  printf("\n");
  printf("KokkosP: Finalization of profiling library.\n");

  struct rusage sys_resources;
  getrusage(RUSAGE_SELF, &sys_resources);

  printf("KokkosP: High water mark memory consumption: %li kB\n",
         (long)sys_resources.ru_maxrss * RU_MAXRSS_UNITS);
  printf("\n");
}